

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O0

int __thiscall
iDynTree::ModelSolidShapes::copy(ModelSolidShapes *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  ModelSolidShapes *pMVar4;
  const_reference ppSVar5;
  undefined4 extraout_var;
  reference this_00;
  reference ppSVar6;
  size_t geom;
  size_t link;
  ModelSolidShapes *in_stack_ffffffffffffffe0;
  ModelSolidShapes *pMVar7;
  ulong local_18;
  
  clear(in_stack_ffffffffffffffe0);
  std::
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  ::size((vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
          *)dst);
  std::
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  ::resize(&in_stack_ffffffffffffffe0->linkSolidShapes,(size_type)this);
  local_18 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
            ::size((vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                    *)dst);
    if (sVar2 <= local_18) break;
    std::
    vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
    ::operator[](&this->linkSolidShapes,local_18);
    pvVar3 = std::
             vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
             ::operator[]((vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                           *)dst,local_18);
    std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::size(pvVar3);
    std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::resize
              ((vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_> *)
               in_stack_ffffffffffffffe0,(size_type)this);
    pMVar7 = (ModelSolidShapes *)0x0;
    while( true ) {
      in_stack_ffffffffffffffe0 = pMVar7;
      pvVar3 = std::
               vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               ::operator[]((vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                             *)dst,local_18);
      pMVar4 = (ModelSolidShapes *)
               std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::size
                         (pvVar3);
      if (pMVar4 <= pMVar7) break;
      pvVar3 = std::
               vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               ::operator[]((vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                             *)dst,local_18);
      ppSVar5 = std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::
                operator[](pvVar3,(size_type)in_stack_ffffffffffffffe0);
      iVar1 = (*(*ppSVar5)->_vptr_SolidShape[2])();
      this_00 = std::
                vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                ::operator[](&this->linkSolidShapes,local_18);
      ppSVar6 = std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::
                operator[](this_00,(size_type)in_stack_ffffffffffffffe0);
      *ppSVar6 = (value_type)CONCAT44(extraout_var,iVar1);
      pMVar7 = (ModelSolidShapes *)
               ((long)&(in_stack_ffffffffffffffe0->linkSolidShapes).
                       super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    local_18 = local_18 + 1;
  }
  return (int)this;
}

Assistant:

ModelSolidShapes& ModelSolidShapes::copy(const ModelSolidShapes& other)
    {
        clear();
        this->linkSolidShapes.resize(other.linkSolidShapes.size());
        for (size_t link = 0; link < other.linkSolidShapes.size(); link++)
        {
            this->linkSolidShapes[link].resize(other.linkSolidShapes[link].size());
            for (size_t geom = 0; geom < other.linkSolidShapes[link].size(); geom++)
            {
                this->linkSolidShapes[link][geom] = other.linkSolidShapes[link][geom]->clone();
            }
        }

        return *this;
    }